

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O3

void __thiscall XMISong::ProcessInitialMetaEvents(XMISong *this)

{
  byte *pbVar1;
  BYTE BVar2;
  TrackInfo *pTVar3;
  ulong uVar4;
  BYTE *pBVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  
  pTVar3 = this->CurrSong;
  uVar4 = pTVar3->EventLen;
  uVar7 = pTVar3->EventP;
  if ((pTVar3->Finished & 1U) == 0) {
    do {
      if ((uVar4 - 3 <= uVar7) || (pBVar5 = pTVar3->EventChunk, pBVar5[uVar7] != 0xff)) break;
      BVar2 = pBVar5[uVar7 + 1];
      uVar8 = 0;
      uVar6 = uVar7 + 2;
      do {
        uVar7 = uVar6;
        if (uVar4 <= uVar6) break;
        uVar7 = uVar6 + 1;
        pTVar3->EventP = uVar7;
        pbVar1 = pBVar5 + uVar6;
        uVar8 = uVar8 << 7 | *pbVar1 & 0x7f;
        uVar6 = uVar7;
      } while ((char)*pbVar1 < '\0');
      uVar7 = uVar8 + uVar7;
      if ((uVar7 <= uVar4) && (BVar2 == '/')) {
        pTVar3->Finished = true;
        pTVar3->EventP = uVar7;
        break;
      }
      pTVar3->EventP = uVar7;
    } while ((pTVar3->Finished & 1U) == 0);
  }
  if (uVar4 - 1 <= uVar7) {
    pTVar3->Finished = true;
  }
  return;
}

Assistant:

void XMISong::ProcessInitialMetaEvents ()
{
	TrackInfo *track = CurrSong;
	BYTE event;
	DWORD len;

	while (!track->Finished &&
			track->EventP < track->EventLen - 3 &&
			track->EventChunk[track->EventP] == MIDI_META)
	{
		event = track->EventChunk[track->EventP+1];
		track->EventP += 2;
		len = track->ReadVarLen();
		if (track->EventP + len <= track->EventLen && event == MIDI_META_EOT)
		{
			track->Finished = true;
		}
		track->EventP += len;
	}
	if (track->EventP >= track->EventLen - 1)
	{
		track->Finished = true;
	}
}